

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O2

bool __thiscall Merlin::read_virtual_evidence(Merlin *this,char *filename)

{
  istream *piVar1;
  mapped_type *this_00;
  runtime_error *this_01;
  size_t k;
  ulong uVar2;
  int iVar3;
  int num_evid;
  size_t dom;
  string err_msg;
  vindex var;
  ifstream in;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&in,filename,_S_in);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) == 0) {
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<double,_std::allocator<double>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<double,_std::allocator<double>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<double,_std::allocator<double>_>_>_>_>
    ::clear(&(this->m_virtualEvidence)._M_t);
    std::istream::operator>>(&in,&num_evid);
    for (iVar3 = 0; iVar3 < num_evid; iVar3 = iVar3 + 1) {
      err_msg._M_dataplus._M_p = (pointer)0x0;
      err_msg._M_string_length = 0;
      err_msg.field_2._M_allocated_capacity = 0;
      piVar1 = std::istream::_M_extract<unsigned_long>((ulong *)&in);
      std::istream::_M_extract<unsigned_long>((ulong *)piVar1);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)&err_msg,dom);
      for (uVar2 = 0; uVar2 < dom; uVar2 = uVar2 + 1) {
        std::istream::_M_extract<double>((double *)&in);
      }
      this_00 = std::
                map<unsigned_long,_std::vector<double,_std::allocator<double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<double,_std::allocator<double>_>_>_>_>
                ::operator[](&this->m_virtualEvidence,&var);
      std::vector<double,_std::allocator<double>_>::operator=
                (this_00,(vector<double,_std::allocator<double>_> *)&err_msg);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&err_msg);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
    return true;
  }
  std::__cxx11::string::string
            ((string *)&err_msg,"Cannot open the virtual evidence file: ",(allocator *)&var);
  std::__cxx11::string::append((char *)&err_msg);
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,(string *)&err_msg);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Merlin::read_virtual_evidence(const char* filename) {
	try {

		// Open the evidence file
		std::ifstream in(filename);
		if (in.fail()) {
			std::string err_msg("Cannot open the virtual evidence file: ");
			err_msg += filename;
			throw std::runtime_error(err_msg);
		}

		// Clear any previous virtual evidence
		m_virtualEvidence.clear();

		// Read the virtual evidence file
		int num_evid;
		in >> num_evid;
		for (int i = 0; i < num_evid; ++i) {
			vindex var;
			size_t dom;
			likelihood l;
			in >> var >> dom;
			l.resize(dom);
			for (size_t k = 0; k < dom; ++k) {
				in >> l[k];
			}

			m_virtualEvidence[var] = l;
		}

		// Close the evidence file
		in.close();

		return true;
	} catch (const std::runtime_error& e) {
		std::cerr << e.what() << std::endl;
		return false;
	}
}